

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O1

void __thiscall
ZXing::Pdf417::ModulusPoly::divide
          (ModulusPoly *this,ModulusPoly *other,ModulusPoly *quotient,ModulusPoly *remainder)

{
  ModulusGF *pMVar1;
  pointer psVar2;
  ModulusPoly *pMVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  invalid_argument *this_00;
  int *piVar7;
  ulong uVar8;
  int coefficient;
  ulong uVar9;
  ModulusPoly term;
  ModulusPoly iterationQuotient;
  ModulusPoly local_b8;
  long local_98;
  ModulusPoly *local_90;
  vector<int,_std::allocator<int>_> *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  ModulusPoly *local_78;
  ModulusPoly local_70;
  ModulusPoly local_50;
  
  pMVar1 = this->_field;
  if (pMVar1 == other->_field) {
    piVar6 = (other->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((other->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish == piVar6) {
LAB_00175d55:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    if (*piVar6 != 0) {
      quotient->_field = (pMVar1->_zero)._field;
      local_80 = &quotient->_coefficients;
      std::vector<int,_std::allocator<int>_>::operator=(local_80,&(pMVar1->_zero)._coefficients);
      remainder->_field = this->_field;
      local_88 = &remainder->_coefficients;
      std::vector<int,_std::allocator<int>_>::operator=(local_88,&this->_coefficients);
      iVar4 = ModulusPoly::coefficient
                        (other,(int)((ulong)((long)(other->_coefficients).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)(other->_coefficients).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2) +
                               -1);
      iVar4 = ModulusGF::inverse(this->_field,iVar4);
      piVar6 = (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar8 = (ulong)((long)piVar7 - (long)piVar6) >> 2;
      uVar9 = (ulong)((long)(other->_coefficients).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(other->_coefficients).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2;
      if ((int)uVar9 <= (int)uVar8) {
        local_98 = (long)iVar4;
        local_90 = remainder;
        local_78 = other;
        do {
          if (piVar7 == piVar6) goto LAB_00175d55;
          if (*piVar6 == 0) {
            return;
          }
          pMVar1 = this->_field;
          iVar5 = ModulusPoly::coefficient(remainder,(int)uVar8 + -1);
          pMVar3 = local_78;
          coefficient = 0;
          if ((iVar4 != 0) && (coefficient = 0, iVar5 != 0)) {
            psVar2 = (pMVar1->_logTable).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                     super__Vector_impl_data._M_start;
            coefficient = (int)(pMVar1->_expTable).super__Vector_base<short,_std::allocator<short>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(long)psVar2[iVar5] + (long)psVar2[local_98]];
          }
          iVar5 = (int)uVar8 - (int)uVar9;
          multiplyByMonomial(&local_70,local_78,iVar5,coefficient);
          ModulusGF::buildMonomial(&local_50,this->_field,iVar5,coefficient);
          add(&local_b8,quotient,&local_50);
          remainder = local_90;
          quotient->_field = local_b8._field;
          std::vector<int,_std::allocator<int>_>::_M_move_assign(local_80,&local_b8._coefficients);
          if (local_b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          subtract(&local_b8,remainder,&local_70);
          remainder->_field = local_b8._field;
          std::vector<int,_std::allocator<int>_>::_M_move_assign(local_88);
          if (local_b8._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_b8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_50._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_50._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_50._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_50._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_70._coefficients.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70._coefficients.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_70._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_70._coefficients.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          piVar6 = (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar7 = (remainder->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar8 = (ulong)((long)piVar7 - (long)piVar6) >> 2;
          uVar9 = (ulong)((long)(pMVar3->_coefficients).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pMVar3->_coefficients).super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2;
        } while ((int)uVar9 <= (int)uVar8);
      }
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Divide by 0");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"ModulusPolys do not have same ModulusGF field")
    ;
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
ModulusPoly::divide(const ModulusPoly& other, ModulusPoly& quotient, ModulusPoly& remainder) const
{
	if (_field != other._field) {
		throw std::invalid_argument("ModulusPolys do not have same ModulusGF field");
	}
	if (other.isZero()) {
		throw std::invalid_argument("Divide by 0");
	}

	quotient = _field->zero();
	remainder = *this;

	int denominatorLeadingTerm = other.coefficient(other.degree());
	int inverseDenominatorLeadingTerm = _field->inverse(denominatorLeadingTerm);

	while (remainder.degree() >= other.degree() && !remainder.isZero()) {
		int degreeDifference = remainder.degree() - other.degree();
		int scale = _field->multiply(remainder.coefficient(remainder.degree()), inverseDenominatorLeadingTerm);
		ModulusPoly term = other.multiplyByMonomial(degreeDifference, scale);
		ModulusPoly iterationQuotient = _field->buildMonomial(degreeDifference, scale);
		quotient = quotient.add(iterationQuotient);
		remainder = remainder.subtract(term);
	}
}